

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

void __thiscall
lr_grammar::GrammarLR::calculate_expression_first
          (GrammarLR *this,int elemIndex,int expressionIndex,
          vector<int,_std::allocator<int>_> *result,bool choose)

{
  pointer piVar1;
  pointer pEVar2;
  pointer pvVar3;
  bool bVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int index;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int expressionIndex_local;
  vector<int,_std::allocator<int>_> notNULL;
  vector<int,_std::allocator<int>_> tmpF;
  
  piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  lVar6 = (long)expressionIndex * 0x18;
  uVar8 = 0;
  expressionIndex_local = expressionIndex;
  do {
    lVar7 = *(long *)&(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                      ._M_impl.super__Vector_impl_data;
    if ((ulong)(*(long *)(lVar7 + 8 + lVar6) - *(long *)(lVar7 + lVar6) >> 2) <= uVar8) {
      return;
    }
    index = (int)uVar8;
    piVar5 = base_grammar::Express::operator[]((Express *)(lVar7 + lVar6),index);
    if (*piVar5 == elemIndex) {
      bVar4 = public_tool::is_in_vector
                        ((this->first).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + elemIndex,-1);
      if (!bVar4) {
        if (!choose) {
          return;
        }
        std::vector<int,_std::allocator<int>_>::push_back(&this->first_temp,&expressionIndex_local);
        return;
      }
    }
    else {
      piVar5 = base_grammar::Express::operator[]
                         ((Express *)
                          (*(long *)&(this->elements).
                                     super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                     ._M_impl.super__Vector_impl_data._M_start[elemIndex].
                                     expression_of_set.
                                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                     ._M_impl.super__Vector_impl_data + lVar6),index);
      bVar4 = get_first(this,*piVar5);
      if (!bVar4) {
        bVar4 = public_tool::is_in_vector(result,-1);
        if (bVar4) {
          return;
        }
        notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,0xffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(result,(int *)&notNULL);
        return;
      }
      pEVar2 = (this->elements).
               super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = *(long *)&pEVar2[elemIndex].expression_of_set.
                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                        ._M_impl.super__Vector_impl_data;
      if ((*(long *)(lVar7 + 8 + lVar6) - *(long *)(lVar7 + lVar6) >> 2) - 1U == uVar8) {
        piVar5 = base_grammar::Express::operator[]((Express *)(lVar7 + lVar6),index);
        public_tool::connect_vector
                  (result,(this->first).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + *piVar5);
      }
      else {
        notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        piVar5 = base_grammar::Express::operator[]
                           ((Express *)
                            (*(long *)&pEVar2[elemIndex].expression_of_set.
                                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                       ._M_impl.super__Vector_impl_data + lVar6),index);
        pvVar3 = (this->first).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar1 = *(pointer *)
                  ((long)&pvVar3[*piVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        lVar7 = *(long *)&pvVar3[*piVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        piVar5 = base_grammar::Express::operator[]
                           ((Express *)
                            (*(long *)&(this->elements).
                                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                       ._M_impl.super__Vector_impl_data._M_start[elemIndex].
                                       expression_of_set.
                                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                       ._M_impl.super__Vector_impl_data + lVar6),index);
        std::vector<int,_std::allocator<int>_>::vector
                  (&tmpF,(this->first).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + *piVar5);
        uVar9 = (ulong)((long)piVar1 - lVar7) >> 2;
        uVar10 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar10 = 0;
        }
        for (lVar7 = 0; uVar10 * 4 != lVar7; lVar7 = lVar7 + 4) {
          if (*(int *)((long)tmpF.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7) != -1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (&notNULL,(value_type_conflict *)
                                ((long)tmpF.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar7));
          }
        }
        public_tool::connect_vector
                  (result,(vector<int,_std::allocator<int>_> *)
                          &notNULL.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&tmpF.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&notNULL.super__Vector_base<int,_std::allocator<int>_>);
      }
      piVar5 = base_grammar::Express::operator[]
                         ((Express *)
                          (*(long *)&(this->elements).
                                     super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                     ._M_impl.super__Vector_impl_data._M_start[elemIndex].
                                     expression_of_set.
                                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                     ._M_impl.super__Vector_impl_data + lVar6),index);
      bVar4 = public_tool::is_in_vector
                        ((this->first).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + *piVar5,-1);
      if (!bVar4) {
        return;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void  GrammarLR::calculate_expression_first(int elemIndex, int expressionIndex, vector<int>& result, bool choose){

    result.clear();
    //vector<int>::iterator it =elements[elemIndex].expression_of_set[expressionIndex].expression.begin() ;
    //vector<int>::iterator end = elements[elemIndex].expression_of_set[expressionIndex].expression.end();




    for (int i = 0; i < elements[elemIndex].expression_of_set[expressionIndex].expression.size(); i++){

        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        if (elements[elemIndex].expression_of_set[expressionIndex][i] == elemIndex) {

            //后续处理
            if (public_tool::is_in_vector(first[elemIndex], -1)) continue;
            else{
                if (choose) this->first_temp.push_back(expressionIndex);
                break;
            }

        }

        if (get_first(elements[elemIndex].expression_of_set[expressionIndex][i])){

            if (i == elements[elemIndex].expression_of_set[expressionIndex].expression.size() - 1){
                public_tool::connect_vector(result, first[elements[elemIndex].expression_of_set[expressionIndex][i]]);
            }
            else
            {
                vector<int> notNULL;//将空串除去
                int length = first[elements[elemIndex].expression_of_set[expressionIndex][i]].size();
                vector<int> tmpF = first[elements[elemIndex].expression_of_set[expressionIndex][i]];
                for (int j = 0; j < length; j++){
                    if (tmpF[j] != -1){
                        notNULL.push_back(tmpF[j]);
                    }
                }
                public_tool::connect_vector(result, notNULL);
            }

        }
        else
        {
            if (!public_tool::is_in_vector(result, -1)) result.push_back(-1);
            break;
        }

        //-1不在这个式子里面后面不用继续了
        if (!public_tool::is_in_vector(first[elements[elemIndex].expression_of_set[expressionIndex][i]], -1)) break;

    }
}